

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O0

RK_S32 mpp_av1_global_motion_params(AV1Context *ctx,BitReadCtx_t *gb,AV1RawFrameHeader *current)

{
  RK_U32 local_40;
  RK_U32 local_3c;
  RK_U32 value_2;
  RK_U32 value_1;
  RK_U32 value;
  RK_S32 err;
  RK_S32 type;
  RK_S32 ref;
  AV1RawFrameHeader *current_local;
  BitReadCtx_t *gb_local;
  AV1Context *ctx_local;
  
  if ((current->frame_type != '\0') && (current->frame_type != '\x02')) {
    err = 1;
    _type = current;
    current_local = (AV1RawFrameHeader *)gb;
    gb_local = &ctx->gb;
    for (; err < 8; err = err + 1) {
      value_1 = mpp_av1_read_unsigned((BitReadCtx_t *)current_local,1,"is_global[ref]",&value_2,0,1)
      ;
      if ((int)value_1 < 0) {
        return value_1;
      }
      _type->is_global[err] = (RK_U8)value_2;
      if (_type->is_global[err] == '\0') {
        value = 0;
      }
      else {
        value_1 = mpp_av1_read_unsigned
                            ((BitReadCtx_t *)current_local,1,"is_rot_zoom[ref]",&local_3c,0,1);
        if ((int)value_1 < 0) {
          return value_1;
        }
        _type->is_rot_zoom[err] = (RK_U8)local_3c;
        if (_type->is_rot_zoom[err] == '\0') {
          value_1 = mpp_av1_read_unsigned
                              ((BitReadCtx_t *)current_local,1,"is_translation[ref]",&local_40,0,1);
          if ((int)value_1 < 0) {
            return value_1;
          }
          _type->is_translation[err] = (RK_U8)local_40;
          value = 3;
          if (_type->is_translation[err] != '\0') {
            value = 1;
          }
        }
        else {
          value = 2;
        }
      }
      if (1 < value) {
        value_1 = mpp_av1_global_motion_param
                            ((AV1Context *)gb_local,(BitReadCtx_t *)current_local,_type,value,err,2)
        ;
        if ((int)value_1 < 0) {
          return value_1;
        }
        value_1 = mpp_av1_global_motion_param
                            ((AV1Context *)gb_local,(BitReadCtx_t *)current_local,_type,value,err,3)
        ;
        if ((int)value_1 < 0) {
          return value_1;
        }
        if (value == 3) {
          value_1 = mpp_av1_global_motion_param
                              ((AV1Context *)gb_local,(BitReadCtx_t *)current_local,_type,3,err,4);
          if ((int)value_1 < 0) {
            return value_1;
          }
          value_1 = mpp_av1_global_motion_param
                              ((AV1Context *)gb_local,(BitReadCtx_t *)current_local,_type,value,err,
                               5);
          if ((int)value_1 < 0) {
            return value_1;
          }
        }
        else {
          _type->gm_params[err][4] = -_type->gm_params[err][3];
          _type->gm_params[err][5] = _type->gm_params[err][2];
        }
      }
      if (0 < (int)value) {
        value_1 = mpp_av1_global_motion_param
                            ((AV1Context *)gb_local,(BitReadCtx_t *)current_local,_type,value,err,0)
        ;
        if ((int)value_1 < 0) {
          return value_1;
        }
        value_1 = mpp_av1_global_motion_param
                            ((AV1Context *)gb_local,(BitReadCtx_t *)current_local,_type,value,err,1)
        ;
        if ((int)value_1 < 0) {
          return value_1;
        }
      }
    }
  }
  return 0;
}

Assistant:

static RK_S32 mpp_av1_global_motion_params(AV1Context *ctx, BitReadCtx_t *gb,
                                           AV1RawFrameHeader *current)
{
    RK_S32 ref, type;
    RK_S32 err;

    if (current->frame_type == AV1_FRAME_KEY ||
        current->frame_type == AV1_FRAME_INTRA_ONLY)
        return 0;

    for (ref = AV1_REF_FRAME_LAST; ref <= AV1_REF_FRAME_ALTREF; ref++) {
        flags(is_global[ref], 1, ref);
        if (current->is_global[ref]) {
            flags(is_rot_zoom[ref], 1, ref);
            if (current->is_rot_zoom[ref]) {
                type = AV1_WARP_MODEL_ROTZOOM;
            } else {
                flags(is_translation[ref], 1, ref);
                type = current->is_translation[ref] ? AV1_WARP_MODEL_TRANSLATION
                       : AV1_WARP_MODEL_AFFINE;
            }
        } else {
            type = AV1_WARP_MODEL_IDENTITY;
        }

        if (type >= AV1_WARP_MODEL_ROTZOOM) {
            CHECK(mpp_av1_global_motion_param(ctx, gb, current, type, ref, 2));
            CHECK(mpp_av1_global_motion_param(ctx, gb, current, type, ref, 3));
            if (type == AV1_WARP_MODEL_AFFINE) {
                CHECK(mpp_av1_global_motion_param(ctx, gb, current, type, ref, 4));
                CHECK(mpp_av1_global_motion_param(ctx, gb, current, type, ref, 5));
            } else {
                current->gm_params[ref][4] =  -current->gm_params[ref][3];
                current->gm_params[ref][5] =   current->gm_params[ref][2];
            }
        }
        if (type >= AV1_WARP_MODEL_TRANSLATION) {
            CHECK(mpp_av1_global_motion_param(ctx, gb, current, type, ref, 0));
            CHECK(mpp_av1_global_motion_param(ctx, gb, current, type, ref, 1));
        }
    }

    return 0;
}